

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# length.cpp
# Opt level: O2

bool __thiscall
duckdb::ArrayLengthBinaryFunctionData::Equals
          (ArrayLengthBinaryFunctionData *this,FunctionData *other)

{
  bool bVar1;
  ArrayLengthBinaryFunctionData *other_data;
  
  bVar1 = ::std::operator==(&(this->dimensions).super_vector<long,_std::allocator<long>_>,
                            (vector<long,_std::allocator<long>_> *)(other + 1));
  return bVar1;
}

Assistant:

bool Equals(const FunctionData &other) const override {
		auto &other_data = other.Cast<const ArrayLengthBinaryFunctionData>();
		return dimensions == other_data.dimensions;
	}